

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

JavascriptString * __thiscall Js::ScriptFunction::EnsureSourceString(ScriptFunction *this)

{
  ScriptContext *scriptContext;
  Utf8SourceInfo *pUVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  FunctionProxy *this_00;
  ParseableFunctionInfo *this_01;
  JavascriptString *sourceString;
  undefined4 *puVar5;
  LPCUTF8 puVar6;
  PrintOffsets *pPVar7;
  char16 *pcVar8;
  WritableString *destSize;
  Recycler *this_02;
  char16_t *dest;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 *count;
  ulong uVar12;
  undefined1 local_80 [8];
  TrackAllocData data;
  LPCUTF8 pbStart;
  BufferStringBuilder local_40;
  BufferStringBuilder builder;
  
  this_00 = GetFunctionProxy(this);
  this_01 = FunctionProxy::EnsureDeserialized(this_00);
  sourceString = ParseableFunctionInfo::GetCachedSourceString(this_01);
  if (sourceString == (JavascriptString *)0x0) {
    scriptContext =
         (((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    pUVar1 = (this_01->super_FunctionProxy).m_utf8SourceInfo.ptr;
    if (((pUVar1 == (Utf8SourceInfo *)0x0) || ((pUVar1->field_0xa8 & 4) == 0)) &&
       (((this_01->super_FunctionProxy).field_0x46 & 8) == 0)) {
      if (((pUVar1->field_0xa8 & 8) == 0) &&
         (((pUVar1->field_0xa8 & 0x10) == 0 ||
          (scriptContext->threadContext->hasUnhandledException == false)))) {
        builder.m_string = (WritableString *)(ulong)this_01->m_cchLength;
        uVar9 = this_01->m_cbLength;
        uVar12 = (ulong)uVar9;
        puVar6 = ParseableFunctionInfo::GetToStringSource
                           (this_01,L"ScriptFunction::EnsureSourceString");
        data._32_8_ = puVar6;
        pPVar7 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)28,Js::PrintOffsets*>
                           (&this_01->super_FunctionProxy);
        if (pPVar7 == (PrintOffsets *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar10 = pPVar7->cbEndPrintOffset - pPVar7->cbStartPrintOffset;
          if (uVar10 < uVar9) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                        ,0x182,
                                        "((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength)"
                                        ,
                                        "(printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength"
                                       );
            if (!bVar3) goto LAB_00be842a;
            *puVar5 = 0;
            uVar10 = pPVar7->cbEndPrintOffset - pPVar7->cbStartPrintOffset;
          }
          uVar4 = ParseableFunctionInfo::StartOffset(this_01);
          uVar9 = pPVar7->cbStartPrintOffset;
          if (uVar4 < uVar9) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                        ,0x185,
                                        "(pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset)"
                                        ,
                                        "pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset"
                                       );
            if (!bVar3) goto LAB_00be842a;
            *puVar5 = 0;
            uVar9 = pPVar7->cbStartPrintOffset;
          }
          uVar11 = uVar10 - uVar12;
          uVar12 = (ulong)(pPVar7->cbEndPrintOffset - uVar9);
          if (0x7ffffffd < uVar11) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                        ,0x188,"(cbPreludeLength < MaxCharCount)",
                                        "cbPreludeLength < MaxCharCount");
            if (!bVar3) goto LAB_00be842a;
            *puVar5 = 0;
          }
        }
        uVar10 = (int)uVar11 + (int)builder.m_string;
        local_40.m_string = BufferStringBuilder::WritableString::New(uVar10,scriptContext);
        uVar9 = *(uint *)&((this_01->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8;
        pcVar8 = BufferStringBuilder::DangerousGetWritableBuffer(&local_40);
        destSize = (WritableString *)
                   utf8::DecodeUnitsInto
                             (pcVar8,(LPCUTF8 *)&data.line,puVar6 + uVar12,
                              uVar9 >> 1 & doAllowThreeByteSurrogates,(bool *)0x0);
        if (destSize < builder.m_string) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                      ,0x194,"(false)",
                                      "Decoded incorrect number of characters for function body");
          if (bVar3) {
            *puVar5 = 0;
            Throw::FatalInternalError(-0x7fffbffb);
          }
          goto LAB_00be842a;
        }
        if (destSize < (WritableString *)(ulong)uVar10) {
          count = (undefined1 *)
                  ((long)&(destSize->super_JavascriptString).super_RecyclableObject.
                          super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject + 1);
          local_80 = (undefined1  [8])&char16_t::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_8b8f4dc;
          data.filename._0_4_ = 0x19b;
          data.plusSize = (size_t)count;
          this_02 = Memory::Recycler::TrackAllocInfo
                              (scriptContext->recycler,(TrackAllocData *)local_80);
          dest = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)this_02,(Recycler *)Memory::Recycler::AllocLeaf,0,
                            (size_t)count);
          pcVar8 = BufferStringBuilder::DangerousGetWritableBuffer(&local_40);
          wmemcpy_s(dest,(size_t)destSize,pcVar8,(size_t)destSize);
          dest[(long)destSize] = L'\0';
          sourceString = JavascriptString::NewWithBuffer(dest,(charcount_t)destSize,scriptContext);
        }
        else {
          sourceString = BufferStringBuilder::ToString(&local_40);
        }
      }
      else {
        sourceString = StringCache::GetXDomainFunctionDisplay
                                 (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                                   stringCache);
      }
    }
    else {
      local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
      pcVar8 = FunctionProxy::GetShortDisplayName
                         (&this_01->super_FunctionProxy,(charcount_t *)local_80);
      sourceString = JavascriptFunction::GetLibraryCodeDisplayString(scriptContext,pcVar8);
    }
    if (sourceString == (JavascriptString *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x1aa,"(cachedSourceString != nullptr)",
                                  "cachedSourceString != nullptr");
      if (!bVar3) {
LAB_00be842a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    ParseableFunctionInfo::SetCachedSourceString(this_01,sourceString);
  }
  return sourceString;
}

Assistant:

JavascriptString * ScriptFunction::EnsureSourceString()
    {
        // The function may be defer serialize, need to be deserialized
        FunctionProxy* proxy = this->GetFunctionProxy();
        ParseableFunctionInfo * pFuncBody = proxy->EnsureDeserialized();
        JavascriptString * cachedSourceString = pFuncBody->GetCachedSourceString();
        if (cachedSourceString != nullptr)
        {
            return cachedSourceString;
        }

        ScriptContext * scriptContext = this->GetScriptContext();

        //Library code should behave the same way as RuntimeFunctions
        Utf8SourceInfo* source = pFuncBody->GetUtf8SourceInfo();
        if ((source != nullptr && source->GetIsLibraryCode())
#ifdef ENABLE_WASM
            || (pFuncBody->IsWasmFunction())
#endif
            )
        {
            //Don't display if it is anonymous function
            charcount_t displayNameLength = 0;
            PCWSTR displayName = pFuncBody->GetShortDisplayName(&displayNameLength);
            cachedSourceString = JavascriptFunction::GetLibraryCodeDisplayString(scriptContext, displayName);
        }
        else if (!pFuncBody->GetUtf8SourceInfo()->GetIsXDomain()
            // To avoid backward compat issue, we will not give out sourceString for function if it is called from
            // window.onerror trying to retrieve arguments.callee.caller.
            && !(pFuncBody->GetUtf8SourceInfo()->GetIsXDomainString() && scriptContext->GetThreadContext()->HasUnhandledException())
            )
        {
            // Decode UTF8 into Unicode
            // Consider: Should we have a JavascriptUtf8Substring class which defers decoding
            // until it's needed?

            charcount_t cch = pFuncBody->LengthInChars();
            size_t cbLength = pFuncBody->LengthInBytes();
            LPCUTF8 pbStart = pFuncBody->GetToStringSource(_u("ScriptFunction::EnsureSourceString"));
            size_t cbPreludeLength = 0;
            // cch and cbLength refer to the length of the parse, which may be smaller than the length of the to-string function
            PrintOffsets* printOffsets = pFuncBody->GetPrintOffsets();
            if (printOffsets != nullptr)
            {
                Assert((printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) >= cbLength);
                cbPreludeLength = (printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset) - cbLength;

                Assert(pFuncBody->StartOffset() >= printOffsets->cbStartPrintOffset);
                cbLength = printOffsets->cbEndPrintOffset - printOffsets->cbStartPrintOffset;
            }
            Assert(cbPreludeLength < MaxCharCount);
            // the toString of a function may include some prelude, e.g. the computed name expression.
            // We do not store the char-index of the start, but if there are cbPreludeLength bytes difference,
            // then that is an upper bound on the number of characters difference.
            // We also assume that function.toString is relatively infrequent, and non-ascii characters in
            // a prelude are relatively infrequent, so the inaccuracy here should in general be insignificant
            BufferStringBuilder builder(cch + static_cast<charcount_t>(cbPreludeLength), scriptContext);
            utf8::DecodeOptions options = pFuncBody->GetUtf8SourceInfo()->IsCesu8() ? utf8::doAllowThreeByteSurrogates : utf8::doDefault;
            size_t decodedCount = utf8::DecodeUnitsInto(builder.DangerousGetWritableBuffer(), pbStart, pbStart + cbLength, options);

            if (decodedCount < cch)
            {
                AssertMsg(false, "Decoded incorrect number of characters for function body");
                Js::Throw::FatalInternalError();
            }
            else if (decodedCount < cch + static_cast<charcount_t>(cbPreludeLength))
            {
                Recycler* recycler = scriptContext->GetRecycler();

                char16* buffer = RecyclerNewArrayLeaf(recycler, char16, decodedCount + 1);
                wmemcpy_s(buffer, decodedCount, builder.DangerousGetWritableBuffer(), decodedCount);
                buffer[decodedCount] = 0;

                cachedSourceString = JavascriptString::NewWithBuffer(buffer, static_cast<charcount_t>(decodedCount), scriptContext);
            }
            else
            {
                cachedSourceString = builder.ToString();
            }
        }
        else
        {
            cachedSourceString = scriptContext->GetLibrary()->GetXDomainFunctionDisplayString();
        }
        Assert(cachedSourceString != nullptr);
        pFuncBody->SetCachedSourceString(cachedSourceString);
        return cachedSourceString;
    }